

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dynamic.hpp
# Opt level: O1

void __thiscall
ELFIO::dynamic_section_accessor_template<ELFIO::section>::generic_get_entry_dyn<ELFIO::Elf64_Dyn>
          (dynamic_section_accessor_template<ELFIO::section> *this,Elf_Xword index,Elf_Xword *tag,
          Elf_Xword *value)

{
  bool bVar1;
  elfio *peVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar5;
  undefined4 extraout_var_05;
  ulong uVar6;
  ulong uVar7;
  
  peVar2 = this->elf_file;
  iVar3 = (*this->dynamic_section->_vptr_section[0x18])();
  if ((CONCAT44(extraout_var,iVar3) == 0) ||
     (iVar3 = (*this->dynamic_section->_vptr_section[0xf])(), CONCAT44(extraout_var_00,iVar3) < 0x10
     )) {
LAB_00116cce:
    *tag = 0;
  }
  else {
    iVar3 = (*this->dynamic_section->_vptr_section[0x13])();
    iVar4 = (*this->dynamic_section->_vptr_section[0xf])();
    if (CONCAT44(extraout_var_01,iVar3) / CONCAT44(extraout_var_02,iVar4) - 1 < index)
    goto LAB_00116cce;
    iVar3 = (*this->dynamic_section->_vptr_section[0xf])();
    uVar7 = CONCAT44(extraout_var_03,iVar3) * index;
    iVar3 = (*this->dynamic_section->_vptr_section[0x13])();
    uVar5 = CONCAT44(extraout_var_04,iVar3) - 0x10;
    if (uVar5 <= uVar7 && uVar7 - uVar5 != 0) goto LAB_00116cce;
    iVar3 = (*this->dynamic_section->_vptr_section[0x18])();
    uVar5 = *(ulong *)(CONCAT44(extraout_var_05,iVar3) + uVar7);
    bVar1 = (peVar2->convertor).need_conversion;
    uVar6 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    if (bVar1 == false) {
      uVar6 = uVar5;
    }
    *tag = uVar6;
    if (((0x21 < uVar6) || ((0x2781ccf06U >> (uVar6 & 0x3f) & 1) != 0)) ||
       ((0x1410001UL >> (uVar6 & 0x3f) & 1) == 0)) {
      uVar5 = *(ulong *)(CONCAT44(extraout_var_05,iVar3) + 8 + uVar7);
      uVar7 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18
              | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18
              | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
      if (bVar1 == false) {
        uVar7 = uVar5;
      }
      goto LAB_00116cd7;
    }
  }
  uVar7 = 0;
LAB_00116cd7:
  *value = uVar7;
  return;
}

Assistant:

void generic_get_entry_dyn( Elf_Xword  index,
                                Elf_Xword& tag,
                                Elf_Xword& value ) const
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        // Check unusual case when dynamic section has no data
        if ( dynamic_section->get_data() == nullptr ||
             dynamic_section->get_entry_size() < sizeof( T ) ) {
            tag   = DT_NULL;
            value = 0;
            return;
        }

        // Check for integer overflow in size calculation
        if (index > (dynamic_section->get_size() / dynamic_section->get_entry_size()) - 1) {
            tag   = DT_NULL;
            value = 0;
            return;
        }

        // Check for integer overflow in pointer arithmetic
        Elf_Xword offset = index * dynamic_section->get_entry_size();
        if (offset > dynamic_section->get_size() - sizeof(T)) {
            tag   = DT_NULL;
            value = 0;
            return;
        }

        const T* pEntry = reinterpret_cast<const T*>(
            dynamic_section->get_data() + offset );
        tag = convertor( pEntry->d_tag );
        switch ( tag ) {
        case DT_NULL:
        case DT_SYMBOLIC:
        case DT_TEXTREL:
        case DT_BIND_NOW:
            value = 0;
            break;
        case DT_NEEDED:
        case DT_PLTRELSZ:
        case DT_RELASZ:
        case DT_RELAENT:
        case DT_STRSZ:
        case DT_SYMENT:
        case DT_SONAME:
        case DT_RPATH:
        case DT_RELSZ:
        case DT_RELENT:
        case DT_PLTREL:
        case DT_INIT_ARRAYSZ:
        case DT_FINI_ARRAYSZ:
        case DT_RUNPATH:
        case DT_FLAGS:
        case DT_PREINIT_ARRAYSZ:
            value = convertor( pEntry->d_un.d_val );
            break;
        case DT_PLTGOT:
        case DT_HASH:
        case DT_STRTAB:
        case DT_SYMTAB:
        case DT_RELA:
        case DT_INIT:
        case DT_FINI:
        case DT_REL:
        case DT_DEBUG:
        case DT_JMPREL:
        case DT_INIT_ARRAY:
        case DT_FINI_ARRAY:
        case DT_PREINIT_ARRAY:
        default:
            value = convertor( pEntry->d_un.d_ptr );
            break;
        }
    }